

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::call_default_signal_handler(int signal_number)

{
  __pid_t __pid;
  _union_1457 local_a8;
  sigaction sig_action;
  int signal_number_local;
  
  sig_action.sa_restorer._4_4_ = signal_number;
  memset(&local_a8,0,0x98);
  sigemptyset((sigset_t *)&sig_action);
  local_a8.sa_handler = (__sighandler_t)0x0;
  sigaction(sig_action.sa_restorer._4_4_,(sigaction *)&local_a8,(sigaction *)0x0);
  __pid = getpid();
  kill(__pid,sig_action.sa_restorer._4_4_);
  return;
}

Assistant:

void call_default_signal_handler(int signal_number)
	{
		struct sigaction sig_action;
		memset(&sig_action, 0, sizeof(sig_action));
		sigemptyset(&sig_action.sa_mask);
		sig_action.sa_handler = SIG_DFL;
		sigaction(signal_number, &sig_action, NULL);
		kill(getpid(), signal_number);
	}